

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

Vec_Str_t *
Bmc_CollapseOneOld(Gia_Man_t *p,int nCubeLim,int nBTLimit,int fCanon,int fReverse,int fVerbose)

{
  sat_solver *psVar1;
  Vec_Str_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  sat_solver *s_00;
  sat_solver *s_01;
  sat_solver *s_02;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *vLits;
  abctime aVar5;
  char Fill;
  Vec_Int_t *pVVar6;
  Vec_Int_t *extraout_RDX;
  Vec_Int_t *extraout_RDX_00;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  int iVar7;
  int i;
  Vec_Str_t *pVVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  int iLit;
  int local_138;
  uint local_134;
  Vec_Int_t *local_130;
  ulong local_128;
  int local_11c;
  Vec_Str_t *local_118;
  Vec_Int_t *local_110;
  uint local_108;
  int local_104;
  abctime local_100;
  sat_solver *local_f8;
  Vec_Int_t *local_f0;
  Vec_Str_t *vSop [2];
  int local_c8 [4];
  Vec_Int_t *vLitsC [2];
  abctime Time [2] [2];
  sat_solver *pSatClean [2];
  sat_solver *pSat [2];
  
  uVar9 = p->vCis->nSize;
  uVar12 = (ulong)uVar9;
  local_11c = nBTLimit;
  local_108 = nCubeLim;
  local_104 = fCanon;
  p_01 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  pSat[0] = s;
  s_00 = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  pSat[1] = s_00;
  s_01 = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  pSatClean[0] = s_01;
  s_02 = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,1,0);
  pSatClean[1] = s_02;
  local_118 = Vec_StrAlloc(1000);
  vSop[0] = local_118;
  vSop[1] = Vec_StrAlloc(1000);
  p_02 = Vec_IntAlloc(uVar9);
  vLitsC[0] = p_02;
  p_03 = Vec_IntAlloc(uVar9);
  vLitsC[1] = p_03;
  local_130 = Vec_IntAlloc(uVar9);
  vLits = Vec_IntAlloc(uVar9);
  local_f0 = Vec_IntAlloc(uVar9);
  local_110 = Vec_IntAlloc(uVar9);
  local_c8[0] = 0;
  local_c8[1] = 0;
  Time[1][0] = 0;
  Time[1][1] = 0;
  Time[0][0] = 0;
  Time[0][1] = 0;
  iVar7 = p_01->nVars;
  local_c8[3] = fReverse;
  if (fReverse == 0) {
    iVar7 = iVar7 - uVar9;
    uVar10 = 0;
    if (0 < (int)uVar9) {
      uVar10 = uVar9;
    }
    while (bVar15 = uVar10 != 0, uVar10 = uVar10 - 1, bVar15) {
      Vec_IntPush(local_130,iVar7);
      iVar7 = iVar7 + 1;
    }
  }
  else {
    for (; iVar7 = iVar7 + -1, 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      Vec_IntPush(local_130,iVar7);
    }
  }
  local_f8 = (sat_solver *)(long)local_11c;
  lVar14 = 0;
  local_138 = fVerbose;
  local_128 = uVar12;
  while( true ) {
    if (lVar14 == 2) break;
    iLit = (uint)lVar14 | 2;
    psVar1 = pSat[lVar14];
    iVar7 = sat_solver_solve(psVar1,&iLit,&local_138,(ABC_INT64_T)local_f8,0,0,0);
    pVVar8 = local_118;
    if (iVar7 == -1) {
      local_118->nSize = 0;
      pcVar13 = " 1\n";
      if (lVar14 == 0) {
        pcVar13 = " 0\n";
      }
      Vec_StrPrintStr(local_118,pcVar13);
      Vec_StrPush(pVVar8,'\0');
      bVar15 = true;
LAB_0046dd9a:
      local_134 = 0;
      uVar9 = (uint)local_128;
      uVar10 = local_134;
      iVar7 = local_138;
      goto LAB_0046dda3;
    }
    if (iVar7 == 0) {
      bVar15 = false;
      goto LAB_0046dd9a;
    }
    iVar7 = local_130->nSize;
    iVar11 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; iVar7 != iVar11; iVar11 = iVar11 + 1) {
      iVar2 = Vec_IntEntry(local_130,iVar11);
      pVVar6 = vLitsC[lVar14];
      iVar2 = Abc_Var2Lit(iVar2,1);
      Vec_IntPush(pVVar6,iVar2);
    }
    iVar7 = sat_solver_addclause(psVar1,&iLit,&local_138);
    if (iVar7 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x38e,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
    }
    iVar7 = sat_solver_addclause(pSatClean[lVar14],&iLit,&local_138);
    if (iVar7 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x390,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
    }
    Vec_StrPush(vSop[lVar14],'\0');
    lVar14 = lVar14 + 1;
  }
  pVVar6 = (Vec_Int_t *)0x0;
  local_100 = 0;
  uVar12 = local_128;
  iVar7 = local_138;
  while( true ) {
    uVar9 = (uint)uVar12;
    local_134 = (uint)pVVar6;
    if ((int)local_108 <= (int)local_134 && local_108 != 0) break;
    pVVar8 = (Vec_Str_t *)0x0;
    while (uVar9 = (uint)uVar12, pVVar8 != (Vec_Str_t *)0x2) {
      if (iVar7 != 0) {
        local_100 = Abc_Clock();
        pVVar6 = extraout_RDX;
      }
      psVar1 = pSat[(long)pVVar8];
      local_f8 = psVar1;
      if (local_104 == 0) {
        sat_solver_clean_polarity(psVar1,local_130->pArray,local_130->nSize);
        iVar11 = sat_solver_solve(psVar1,(lit *)0x0,(lit *)0x0,0,0,0,0);
      }
      else {
        iVar11 = Bmc_ComputeCanonical(psVar1,vLitsC[(long)pVVar8],pVVar6,local_11c);
      }
      if (iVar7 != 0) {
        aVar5 = Abc_Clock();
        Time[(long)pVVar8][0] = Time[(long)pVVar8][0] + (aVar5 - local_100);
      }
      psVar1 = local_f8;
      if (iVar11 == 0) {
        bVar15 = false;
        uVar10 = 0;
        goto LAB_0046dda3;
      }
      if (iVar11 == -1) {
        pVVar8 = (Vec_Str_t *)((ulong)pVVar8 & 0xffffffff);
LAB_0046dd26:
        local_c8[(long)pVVar8] = 1;
        break;
      }
      vLits->nSize = 0;
      pVVar6 = vLitsC[(long)pVVar8];
      pVVar6->nSize = 0;
      iVar2 = 0;
      local_118 = pVVar8;
      iVar11 = local_130->nSize;
      if (local_130->nSize < 1) {
        iVar11 = 0;
      }
      for (; iVar7 = local_138, iVar11 != iVar2; iVar2 = iVar2 + 1) {
        iVar7 = Vec_IntEntry(local_130,iVar2);
        uVar9 = sat_solver_var_value(psVar1,iVar7);
        iLit = Abc_Var2Lit(iVar7,uVar9 ^ 1);
        Vec_IntPush(vLits,iLit);
        Vec_IntPush(pVVar6,iLit);
      }
      if (local_138 != 0) {
        local_100 = Abc_Clock();
      }
      pVVar8 = local_118;
      iVar11 = Bmc_CollapseExpand(pSatClean[(ulong)local_118 & 0xffffffff ^ 1],psVar1,vLits,local_f0
                                  ,local_110,local_11c,local_104,-1);
      if (iVar7 != 0) {
        aVar5 = Abc_Clock();
        Time[(long)pVVar8][1] = Time[(long)pVVar8][1] + (aVar5 - local_100);
      }
      if (iVar11 < 0) {
        uVar10 = 0;
        bVar15 = false;
        uVar9 = (uint)local_128;
        goto LAB_0046dda3;
      }
      p_00 = vSop[(long)pVVar8];
      Vec_StrPop(p_00);
      iVar7 = p_00->nSize;
      iVar11 = (int)local_128;
      Vec_StrFillExtra(p_00,iVar7 + iVar11 + 4,Fill);
      Vec_StrWriteEntry(p_00,iVar7 + iVar11,' ');
      i = 0;
      Vec_StrWriteEntry(p_00,iVar7 + iVar11 + 1,(pVVar8 == (Vec_Str_t *)0x0) + '0');
      Vec_StrWriteEntry(p_00,iVar7 + iVar11 + 2,'\n');
      Vec_StrWriteEntry(p_00,iVar7 + iVar11 + 3,'\0');
      local_110->nSize = 0;
      iVar2 = local_f0->nSize;
      if (local_f0->nSize < 1) {
        iVar2 = i;
      }
      for (; iVar2 != i; i = i + 1) {
        uVar9 = Vec_IntEntry(local_f0,i);
        iLit = Vec_IntEntry(vLits,uVar9);
        iVar3 = Abc_LitNot(iLit);
        Vec_IntPush(local_110,iVar3);
        iVar3 = uVar9 + iVar7;
        if (local_c8[3] != 0) {
          iVar3 = ~uVar9 + iVar7 + iVar11;
        }
        iVar4 = Abc_LitIsCompl(iLit);
        Vec_StrWriteEntry(p_00,iVar3,(byte)iVar4 ^ 0x31);
      }
      iVar11 = sat_solver_addclause(local_f8,local_110->pArray,local_110->pArray + local_110->nSize)
      ;
      iVar7 = local_138;
      uVar12 = local_128;
      if (iVar11 != 1) {
        pVVar8 = local_118;
        if (iVar11 != 0) {
          __assert_fail("status == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcClp.c"
                        ,0x3d3,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)"
                       );
        }
        goto LAB_0046dd26;
      }
      pVVar6 = extraout_RDX_00;
      pVVar8 = (Vec_Str_t *)((long)&local_118->nCap + 1);
    }
    uVar9 = (uint)uVar12;
    uVar10 = local_c8[1];
    iVar11 = local_c8[0];
    if (local_c8[0] != 0 || local_c8[1] != 0) goto LAB_0046df50;
    pVVar6 = (Vec_Int_t *)(ulong)(local_134 + 1);
  }
  iVar11 = 0;
  uVar10 = 0;
LAB_0046df50:
  bVar15 = iVar11 != 0;
LAB_0046dda3:
  Vec_IntFree(local_130);
  Vec_IntFree(vLits);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  Vec_IntFree(local_f0);
  Vec_IntFree(local_110);
  Cnf_DataFree(p_01);
  sat_solver_delete(s);
  sat_solver_delete(s_00);
  sat_solver_delete(s_01);
  sat_solver_delete(s_02);
  if ((bVar15) && (uVar10 != 0)) {
    __assert_fail("!fComplete[0] || !fComplete[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x3e4,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
  }
  if ((bool)(bVar15 | uVar10 != 0)) {
    pVVar8 = vSop[(int)uVar10];
    vSop[(int)uVar10] = (Vec_Str_t *)0x0;
    if (1 < local_134) {
      Bmc_CollapseIrredundantFull(pVVar8,pVVar8->nSize / (int)(uVar9 + 3),uVar9);
    }
  }
  else {
    pVVar8 = (Vec_Str_t *)0x0;
  }
  if (iVar7 != 0) {
    printf("Processed output with %d supp vars. ",(ulong)uVar9);
    if (pVVar8 == (Vec_Str_t *)0x0) {
      pcVar13 = "The resulting SOP exceeded %d cubes.\n";
      uVar12 = (ulong)local_108;
    }
    else {
      pcVar13 = "The best cover contains %d cubes.\n";
      uVar12 = (long)pVVar8->nSize / (long)(int)(uVar9 + 3) & 0xffffffff;
    }
    printf(pcVar13,uVar12);
    Abc_PrintTime(0x7e9874,(char *)Time[0][0],time);
    Abc_PrintTime(0x7e9883,(char *)Time[0][1],time_00);
    Abc_PrintTime(0x7e9892,(char *)Time[1][0],time_01);
    Abc_PrintTime(0x7e98a1,(char *)Time[1][1],time_02);
  }
  Vec_StrFreeP(vSop);
  Vec_StrFreeP(vSop + 1);
  return pVVar8;
}

Assistant:

Vec_Str_t * Bmc_CollapseOneOld( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    int nVars = Gia_ManCiNum(p);
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat[2]      = { (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0), (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0) };
    sat_solver * pSatClean[2] = { (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0), (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0) };
    Vec_Str_t * vSop[2]   = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vLitsC[2] = { Vec_IntAlloc(nVars), Vec_IntAlloc(nVars) };
    Vec_Int_t * vVars = Vec_IntAlloc( nVars );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars );
    int n, v, iVar, iLit, iCiVarBeg, iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};

    // collect CI variables
    iCiVarBeg = pCnf->nVars - nVars;// - 1;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        iLit = Abc_Var2Lit( 1, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat[n], &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // start with all negative literals
        Vec_IntForEachEntry( vVars, iVar, v )
            Vec_IntPush( vLitsC[n], Abc_Var2Lit(iVar, 1) );
        // add literals to the solver
        status = sat_solver_addclause( pSat[n], &iLit, &iLit + 1 );
        assert( status );
        status = sat_solver_addclause( pSatClean[n], &iLit, &iLit + 1 );
        assert( status );
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            if ( fCanon )
                status = Bmc_ComputeCanonical( pSat[n], vLitsC[n], vCube, nBTLimit );
            else
            {
                sat_solver_clean_polarity( pSat[n], Vec_IntArray(vVars), Vec_IntSize(vVars) );
                status = sat_solver_solve( pSat[n], NULL, NULL, 0, 0, 0, 0 );
            }
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntClear( vLitsC[n] );
            Vec_IntForEachEntry( vVars, iVar, v )
            {
                iLit = Abc_Var2Lit(iVar, !sat_solver_var_value(pSat[n], iVar));
                Vec_IntPush( vLits, iLit );
                Vec_IntPush( vLitsC[n], iLit );
            }
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
            status = Bmc_CollapseExpand( pSatClean[!n], pSat[n], vLits, vNums, vCube, nBTLimit, fCanon, -1 );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
            status = sat_solver_addclause( pSat[n], Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vLitsC[0] );
    Vec_IntFree( vLitsC[1] );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat[0] );
    sat_solver_delete( pSat[1] );
    sat_solver_delete( pSatClean[0] );
    sat_solver_delete( pSatClean[1] );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}